

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepidselect.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pvVar1;
  int iVar2;
  size_t __n;
  long lVar3;
  pointer pHVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ostream *poVar11;
  Header *pHVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  char *pcVar15;
  int *piVar16;
  _Rb_tree_node_base *p_Var17;
  _Rb_tree_node_base *p_Var19;
  mapped_type *pmVar20;
  CompressedIDManifest *pCVar21;
  int iVar22;
  int iVar23;
  _List_node_base *p_Var24;
  ulong uVar25;
  _List_node_base *p_Var26;
  size_type sVar27;
  ushort uVar28;
  int iVar29;
  pointer pvVar30;
  uint uVar31;
  int h;
  long lVar32;
  long lVar33;
  size_type sVar34;
  bool bVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  size_type local_268;
  int local_24c;
  _Rb_tree_color local_244;
  ulong local_228;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> hdrs;
  MultiPartOutputFile output;
  MultiPartInputFile input;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d8;
  char **local_1d0;
  vector<int,_std::allocator<int>_> pixelCounts;
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  scanLine;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> outputAlpha;
  DeepScanLineInputPart inPart;
  vector<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
  scanPointers;
  list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
  ids;
  DeepFrameBuffer buf;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  channelToPos;
  FrameBuffer outBuf;
  IDManifest mfst;
  DeepScanLineOutputPart outPart;
  ulong uVar18;
  
  if (argc < 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "syntax: [--mask] input.exr match [match...] [--and match [match...]] output.exr\n",
               0x50);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               " if --mask specified, writes a shallow EXR with a mask of the selected object(s) in the \'A\' channel\n"
               ,100);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               " otherwise, writes a deep EXR only containing the selected object(s)\n",0x45);
    buf._map._M_t._M_impl._0_1_ = 10;
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&buf,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," matches can be:\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"   searchstring - match any component of any channel\n",0x35);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"   componentname:searchstring - only match given component\n",0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"   channelname:number - match specified numeric ID in given channel\n",0x44)
    ;
    buf._map._M_t._M_impl._0_1_ = 10;
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&buf,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,
               "\"A B --and C D\" means \"(must match either A or B) and also (must match either C or D)\"\n"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," e.g:\n",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"  input.deep.exr blue output.deep.exr\n",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"  input.deep.exr material:blue --and model:blob output.deep.exr\n",0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,
               "  input.deep.exr material:blue material:red --and model:blob output.deep.exr\n",0x4d
              );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"  input.deep.exr particleid:3 output.deep.exr\n",0x2e);
    iVar6 = 1;
  }
  else {
    pcVar15 = argv[1];
    iVar6 = strcmp(pcVar15,"--mask");
    if (iVar6 == 0) {
      local_24c = argc + -3;
      local_1d0 = argv + 3;
      pcVar15 = argv[2];
    }
    else {
      local_24c = argc + -2;
      local_1d0 = argv + 2;
    }
    iVar7 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartInputFile::MultiPartInputFile(&input,pcVar15,iVar7,true);
    pHVar12 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&input);
    cVar5 = Imf_3_4::hasIDManifest(pHVar12);
    if (cVar5 == '\0') {
      iVar6 = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"deepidselect requires an ID manifest in the EXR header\n",
                 0x37);
    }
    else {
      for (iVar7 = 0; iVar8 = Imf_3_4::MultiPartInputFile::parts(), iVar7 < iVar8; iVar7 = iVar7 + 1
          ) {
        Imf_3_4::MultiPartInputFile::header((int)&input);
        puVar13 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
        __n = puVar13[1];
        if ((__n != _DAT_0010b358) ||
           ((__n != 0 &&
            (iVar8 = bcmp((void *)*puVar13,Imf_3_4::DEEPSCANLINE_abi_cxx11_,__n), iVar8 != 0)))) {
          iVar6 = 1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "deepidselect currently only supports files which are entirely deep scanline files\n"
                     ,0x52);
          goto LAB_00105762;
        }
      }
      iVar7 = Imf_3_4::MultiPartInputFile::parts();
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
                (&hdrs,(long)iVar7,(allocator_type *)&buf);
      if (iVar6 == 0) {
        lVar33 = 0;
        for (lVar32 = 0; iVar7 = Imf_3_4::MultiPartInputFile::parts(), lVar32 < iVar7;
            lVar32 = lVar32 + 1) {
          Imf_3_4::MultiPartInputFile::header((int)&input);
          puVar13 = (undefined8 *)Imf_3_4::Header::dataWindow();
          puVar14 = (undefined8 *)Imf_3_4::Header::dataWindow();
          *puVar14 = *puVar13;
          puVar14[1] = puVar13[1];
          Imf_3_4::Header::setType
                    ((string *)
                     (hdrs.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar33));
          puVar13 = (undefined8 *)Imf_3_4::Header::displayWindow();
          puVar14 = (undefined8 *)Imf_3_4::Header::displayWindow();
          *puVar14 = *puVar13;
          puVar14[1] = puVar13[1];
          cVar5 = Imf_3_4::Header::hasView();
          pHVar4 = hdrs.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (cVar5 != '\0') {
            Imf_3_4::Header::view_abi_cxx11_();
            Imf_3_4::Header::setView((string *)(pHVar4 + lVar33));
          }
          cVar5 = Imf_3_4::Header::hasName();
          pHVar4 = hdrs.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (cVar5 != '\0') {
            Imf_3_4::Header::name_abi_cxx11_();
            Imf_3_4::Header::setName((string *)(pHVar4 + lVar33));
          }
          pcVar15 = (char *)Imf_3_4::Header::channels();
          Imf_3_4::Channel::Channel((Channel *)&buf,HALF,1,1,false);
          Imf_3_4::ChannelList::insert(pcVar15,(Channel *)"A");
          lVar33 = lVar33 + 0x38;
        }
      }
      else {
        lVar33 = 0;
        for (lVar32 = 0; iVar7 = Imf_3_4::MultiPartInputFile::parts(), lVar32 < iVar7;
            lVar32 = lVar32 + 1) {
          pHVar12 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&input);
          Imf_3_4::Header::operator=
                    (hdrs.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar33,pHVar12);
          lVar33 = lVar33 + 0x38;
        }
      }
      pcVar15 = argv[(ulong)(uint)argc - 1];
      iVar7 = Imf_3_4::MultiPartInputFile::parts();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                (&output,pcVar15,
                 hdrs.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
                 super__Vector_impl_data._M_start,iVar7,false,iVar8);
      iVar7 = 0;
      while( true ) {
        iVar8 = Imf_3_4::MultiPartInputFile::parts();
        if (iVar8 <= iVar7) break;
        pHVar12 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&input);
        Imf_3_4::Header::channels();
        piVar16 = (int *)Imf_3_4::Header::dataWindow();
        iVar8 = *piVar16;
        iVar29 = piVar16[1];
        iVar22 = piVar16[2];
        iVar2 = piVar16[3];
        channelToPos._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        channelToPos._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        channelToPos._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &channelToPos._M_t._M_impl.super__Rb_tree_header._M_header;
        channelToPos._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        channelToPos._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             channelToPos._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var17 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
        uVar9 = iVar22 - iVar8;
        uVar10 = uVar9 + 1;
        uVar18 = (ulong)uVar10;
        local_244 = _S_black;
        local_228 = 0xffffffff;
        local_268 = 0;
        while( true ) {
          p_Var19 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
          iVar22 = (int)local_268;
          if (p_Var17 == p_Var19) break;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&buf,(char *)(p_Var17 + 1),(allocator<char> *)&outPart);
          pmVar20 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](&channelToPos,(key_type *)&buf);
          *pmVar20 = iVar22;
          if ((_Base_ptr *)CONCAT71(buf._map._M_t._M_impl._1_7_,buf._map._M_t._M_impl._0_1_) !=
              &buf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((undefined1 *)
                            CONCAT71(buf._map._M_t._M_impl._1_7_,buf._map._M_t._M_impl._0_1_),
                            (ulong)((long)&(buf._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                           _M_parent)->_M_color + 1));
          }
          if (((char)p_Var17[1]._M_color == 0x41) &&
             (*(byte *)((long)&p_Var17[1]._M_color + 1) == 0)) {
            local_244 = p_Var17[9]._M_color;
            local_228 = local_268 & 0xffffffff;
          }
          p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
          local_268 = local_268 + 1;
        }
        Imf_3_4::hasIDManifest(pHVar12);
        ids.
        super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
        ._M_impl._M_node._M_size = 0;
        ids.
        super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ids;
        ids.
        super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&ids;
        pHVar12 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&input);
        pCVar21 = (CompressedIDManifest *)Imf_3_4::idManifest(pHVar12);
        Imf_3_4::IDManifest::IDManifest(&mfst,pCVar21);
        setIds(&mfst,&ids,local_1d0,local_24c,&channelToPos);
        std::
        vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
        ::vector(&scanLine,local_268,(allocator_type *)&buf);
        std::
        vector<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
        ::vector(&scanPointers,local_268,(allocator_type *)&buf);
        sVar34 = (size_type)(int)uVar10;
        if (iVar22 != 0) {
          lVar32 = 0;
          sVar27 = local_268;
          do {
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::resize((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)((long)&((scanLine.
                                  super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar32),sVar34);
            std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::resize
                      ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)
                       ((long)&((scanPointers.
                                 super__Vector_base<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar32),sVar34);
            lVar32 = lVar32 + 0x18;
            sVar27 = sVar27 - 1;
          } while (sVar27 != 0);
        }
        std::vector<int,_std::allocator<int>_>::vector(&pixelCounts,sVar34,(allocator_type *)&buf);
        std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector
                  (&outputAlpha,sVar34,(allocator_type *)&buf);
        buf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        buf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        buf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &buf._map._M_t._M_impl.super__Rb_tree_header._M_header;
        buf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        buf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             buf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        Imf_3_4::Slice::Slice(&buf._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
        Imf_3_4::Slice::Slice
                  ((Slice *)&outPart,UINT,
                   (char *)((long)pixelCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start - (long)iVar8),4,0,1,1,0.0,false,
                   false);
        Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&buf);
        p_Var17 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
        lVar32 = -(long)iVar8;
        lVar33 = 0;
        while (p_Var19 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end(), p_Var17 != p_Var19) {
          Imf_3_4::DeepSlice::DeepSlice
                    ((DeepSlice *)&outPart,p_Var17[9]._M_color,
                     (char *)(*(long *)((long)&((scanPointers.
                                                 super__Vector_base<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start + lVar33)
                             + lVar32),8,0,4,1,1,0.0,false,false);
          Imf_3_4::DeepFrameBuffer::insert((char *)&buf,(DeepSlice *)(p_Var17 + 1));
          p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
          lVar33 = lVar33 + 0x18;
        }
        Imf_3_4::DeepScanLineInputPart::DeepScanLineInputPart(&inPart,&input,iVar7);
        Imf_3_4::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)&inPart);
        if (iVar6 == 0) {
          outBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          outBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          outBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &outBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
          outBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          outBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               outBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Imf_3_4::Slice::Slice
                    ((Slice *)&outPart,HALF,
                     (char *)(lVar32 + (long)outputAlpha.
                                             super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                             ._M_impl.super__Vector_impl_data._M_start),2,0,1,1,0.0,
                     false,false);
          Imf_3_4::FrameBuffer::insert((char *)&outBuf,(Slice *)"A");
          Imf_3_4::OutputPart::OutputPart((OutputPart *)&outPart,&output,iVar7);
          Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)&outPart);
          std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                       *)&outBuf);
        }
        else {
          Imf_3_4::DeepScanLineOutputPart::DeepScanLineOutputPart(&outPart,&output,iVar7);
          Imf_3_4::DeepScanLineOutputPart::setFrameBuffer((DeepFrameBuffer *)&outPart);
        }
        if (iVar29 <= iVar2) {
          if ((int)uVar10 < 2) {
            uVar18 = 1;
          }
          do {
            Imf_3_4::DeepScanLineInputPart::readPixelSampleCounts((int)&inPart);
            if (iVar22 != 0) {
              sVar34 = 0;
              do {
                if (uVar9 < 0x7fffffff) {
                  uVar25 = 0;
                  do {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                              (scanLine.
                               super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[sVar34].
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar25,
                               (long)pixelCounts.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar25]);
                    scanPointers.
                    super__Vector_base<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar34].
                    super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar25] =
                         scanLine.
                         super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[sVar34].
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar25].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                    uVar25 = uVar25 + 1;
                  } while (uVar25 != uVar18);
                }
                sVar34 = sVar34 + 1;
              } while (local_268 != sVar34);
            }
            Imf_3_4::DeepScanLineInputPart::readPixels((int)&inPart);
            if (uVar9 < 0x7fffffff) {
              uVar25 = 0;
              do {
                lVar32 = _imath_half_to_float_table;
                iVar8 = pixelCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar25];
                if (iVar8 < 1) {
                  fVar37 = 0.0;
                  iVar23 = 0;
                  fVar36 = 0.0;
                }
                else {
                  pvVar1 = scanLine.
                           super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (int)local_228;
                  lVar33 = 0;
                  fVar36 = 0.0;
                  fVar37 = 0.0;
                  iVar23 = 0;
                  do {
                    p_Var24 = ids.
                              super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                              ._M_impl._M_node.super__List_node_base._M_next;
                    if (ids.
                        super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&ids) {
                      bVar35 = true;
                    }
                    else {
                      do {
                        p_Var26 = p_Var24[1]._M_next;
                        if (p_Var26 == p_Var24 + 1) {
                          if (iVar6 != 0) goto LAB_0010554a;
                          bVar35 = false;
                          goto LAB_001054a7;
                        }
                        do {
                          if (*(int *)(*(long *)&scanLine.
                                                 super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start
                                                 [*(int *)&p_Var26[1]._M_next].
                                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar25].
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data + lVar33 * 4) ==
                              *(int *)((long)&p_Var26[1]._M_next + 4)) {
                            bVar35 = true;
                            if (((long)*(int *)&p_Var26[1]._M_prev == -1) ||
                               (*(int *)(*(long *)&scanLine.
                                                  super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [*(int *)&p_Var26[1]._M_prev].
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar25].
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data + lVar33 * 4) ==
                                *(int *)((long)&p_Var26[1]._M_prev + 4))) goto LAB_001053fd;
                          }
                          p_Var26 = p_Var26->_M_next;
                        } while (p_Var26 != p_Var24 + 1);
                        bVar35 = false;
LAB_001053fd:
                        p_Var24 = (((_List_impl *)&p_Var24->_M_next)->_M_node).super__List_node_base
                                  ._M_next;
                      } while ((p_Var24 != (_List_node_base *)&ids) && (bVar35));
                    }
                    if (iVar6 == 0) {
LAB_001054a7:
                      if (local_244 == _S_red) {
                        fVar38 = (float)*(uint *)(*(long *)&(pvVar1->
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar25]
                                                  .
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data + lVar33 * 4);
                      }
                      else if (local_244 == _S_black) {
                        fVar38 = *(float *)(lVar32 + (ulong)*(ushort *)
                                                             (*(long *)&(pvVar1->
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar25]
                                                  .
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data + lVar33 * 4) * 4
                                           );
                      }
                      else {
                        fVar38 = 0.0;
                        if (local_244 == 2) {
                          fVar38 = *(float *)(*(long *)&(pvVar1->
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar25]
                                                  .
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data + lVar33 * 4);
                        }
                      }
                      fVar38 = fVar38 * (1.0 - fVar37);
                      if (bVar35) {
                        fVar36 = fVar36 + fVar38;
                      }
                      fVar37 = fVar38 + fVar37;
                    }
                    else if (bVar35) {
                      if (iVar22 != 0) {
                        sVar34 = local_268;
                        pvVar30 = scanLine.
                                  super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        do {
                          lVar3 = *(long *)&(pvVar30->
                                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start[uVar25].
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data;
                          *(undefined4 *)(lVar3 + (long)iVar23 * 4) =
                               *(undefined4 *)(lVar3 + lVar33 * 4);
                          pvVar30 = pvVar30 + 1;
                          sVar34 = sVar34 - 1;
                        } while (sVar34 != 0);
                        iVar8 = pixelCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar25];
                      }
                      iVar23 = iVar23 + 1;
                    }
LAB_0010554a:
                    lVar33 = lVar33 + 1;
                  } while (lVar33 < iVar8);
                }
                if (iVar6 == 0) {
                  uVar10 = ~-(uint)(0.0 < fVar37) & (uint)fVar36 |
                           (uint)(fVar36 / fVar37) & -(uint)(0.0 < fVar37);
                  uVar31 = uVar10 & 0x7fffffff;
                  uVar28 = (ushort)(uVar10 >> 0x10) & 0x8000;
                  if (uVar31 < 0x38800000) {
                    if ((0x33000000 < uVar31) &&
                       (uVar10 = uVar10 & 0x7fffff | 0x800000, cVar5 = (char)(uVar31 >> 0x17),
                       uVar28 = uVar28 | (ushort)(uVar10 >> (0x7eU - cVar5 & 0x1f)),
                       0x80000000 < uVar10 << (cVar5 + 0xa2U & 0x1f))) {
                      uVar28 = uVar28 + 1;
                    }
                  }
                  else if (uVar31 < 0x7f800000) {
                    if (uVar31 < 0x477ff000) {
                      uVar28 = (ushort)(uVar31 + 0x8000fff + (uint)((uVar31 >> 0xd & 1) != 0) >> 0xd
                                       ) | uVar28;
                    }
                    else {
                      uVar28 = uVar28 | 0x7c00;
                    }
                  }
                  else {
                    uVar28 = uVar28 | 0x7c00;
                    if (uVar31 != 0x7f800000) {
                      uVar10 = uVar31 >> 0xd & 0x3ff;
                      uVar28 = uVar28 | (ushort)uVar10 | (ushort)(uVar10 == 0);
                    }
                  }
                  outputAlpha.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar25]._h = uVar28;
                }
                else {
                  pixelCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar25] = iVar23;
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar18);
            }
            iVar8 = (int)&outPart;
            if (iVar6 == 0) {
              Imf_3_4::OutputPart::OutputPart((OutputPart *)&outPart,&output,iVar7);
              Imf_3_4::OutputPart::writePixels(iVar8);
            }
            else {
              Imf_3_4::DeepScanLineOutputPart::DeepScanLineOutputPart(&outPart,&output,iVar7);
              Imf_3_4::DeepScanLineOutputPart::writePixels(iVar8);
            }
            bVar35 = iVar29 != iVar2;
            iVar29 = iVar29 + 1;
          } while (bVar35);
        }
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                     *)&buf);
        if (outputAlpha.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(outputAlpha.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)outputAlpha.
                                super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)outputAlpha.
                                super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (pixelCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(pixelCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)pixelCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)pixelCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::
        vector<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
        ::~vector(&scanPointers);
        std::
        vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
        ::~vector(&scanLine);
        std::
        vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
        ::~vector((vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                   *)&mfst);
        std::__cxx11::
        _List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
        ::_M_clear((_List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                    *)&ids);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~_Rb_tree(&channelToPos._M_t);
        iVar7 = iVar7 + 1;
      }
      Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&output);
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&hdrs);
      iVar6 = 0;
    }
LAB_00105762:
    if (local_1d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8);
    }
    if (local_1e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8);
    }
  }
  return iVar6;
}

Assistant:

int
main (int argc, const char* argv[])
{
    if (argc < 4)
    {
        cerr
            << "syntax: [--mask] input.exr match [match...] [--and match [match...]] output.exr\n"
            << " if --mask specified, writes a shallow EXR with a mask of the selected object(s) in the 'A' channel\n"
            << " otherwise, writes a deep EXR only containing the selected object(s)\n"
            << '\n'
            << " matches can be:\n"
            << "   searchstring - match any component of any channel\n"
            << "   componentname:searchstring - only match given component\n"
            << "   channelname:number - match specified numeric ID in given channel\n"
            << '\n'
            << "\"A B --and C D\" means \"(must match either A or B) and also (must match either C or D)\"\n"
            << " e.g:\n"
            << "  input.deep.exr blue output.deep.exr\n"
            << "  input.deep.exr material:blue --and model:blob output.deep.exr\n"
            << "  input.deep.exr material:blue material:red --and model:blob output.deep.exr\n"
            << "  input.deep.exr particleid:3 output.deep.exr\n";
        return 1;
    }

    bool         mask              = false;
    int          numMatchArguments = argc - 2;
    const char** matchArguments    = argv + 2;
    const char*  inputFile         = argv[1];
    if (strcmp (argv[1], "--mask") == 0)
    {
        mask = true;
        numMatchArguments--;
        matchArguments++;
        inputFile = argv[2];
    }

    MultiPartInputFile input (inputFile);

    if (!hasIDManifest (input.header (0)))
    {
        cerr << "deepidselect requires an ID manifest in the EXR header\n";
        return 1;
    }

    for (int i = 0; i < input.parts (); ++i)
    {
        if (input.header (i).type () != DEEPSCANLINE)
        {
            cerr
                << "deepidselect currently only supports files which are entirely deep scanline files\n";
            return 1;
        }
    }

    //
    // build output headers. For deep output, this is easy: just copy them over
    // for masks, build scanline images of the same dimensions, each with a single alpha channel
    //
    vector<Header> hdrs (input.parts ());
    if (mask)
    {
        for (int h = 0; h < input.parts (); ++h)
        {
            const Header& inHdr   = input.header (h);
            hdrs[h].dataWindow () = inHdr.dataWindow ();
            hdrs[h].setType (SCANLINEIMAGE);
            hdrs[h].displayWindow () = inHdr.displayWindow ();
            if (inHdr.hasView ()) { hdrs[h].setView (inHdr.view ()); }
            if (inHdr.hasName ()) { hdrs[h].setName (inHdr.name ()); }
            hdrs[h].channels ().insert ("A", Channel (HALF));
        }
    }
    else
    {
        for (int h = 0; h < input.parts (); ++h)
        {
            hdrs[h] = input.header (h);
        }
    }

    MultiPartOutputFile output (argv[argc - 1], hdrs.data (), input.parts ());

    // process each part individually

    for (int pt = 0; pt < input.parts (); ++pt)
    {
        const Header&      inputHeader = input.header (pt);
        const ChannelList& inputChans  = inputHeader.channels ();
        Box2i              dataWindow  = inputHeader.dataWindow ();
        int                width = dataWindow.max.x + 1 - dataWindow.min.x;

        map<string, int>
            channelToPos; // index of each channel as stored in scanLine object

        int       alphaChannel     = -1;
        PixelType alphaChannelType = HALF;

        int channels = 0;
        for (ChannelList::ConstIterator i = inputChans.begin ();
             i != inputChans.end ();
             ++i)
        {
            channelToPos[i.name ()] = channels;
            if (strcmp (i.name (), "A") == 0)
            {
                alphaChannel     = channels;
                alphaChannelType = i.channel ().type;
            }
            channels++;
        }

        // if the part has a manifest, use this part's manifest
        // otherwise use part 0's manifest.
        // (but reparse the manifest for every part in case the channel list has changed)
        //
        int               manifestPart = hasIDManifest (inputHeader) ? pt : 0;
        list<list<match>> ids;
        IDManifest        mfst = idManifest (input.header (manifestPart));

        setIds (mfst, ids, matchArguments, numMatchArguments, channelToPos);

        // store for an individual deep scanline. Accessed using scanLine[channelIndex][pixelIndex][sampleIndex]
        // where pixelIndex is 0 for the leftmost pixel (even if the dataWindow doesn't start at 0)
        vector<vector<vector<uint32_t>>> scanLine (channels);

        // pointers to the data in each channel for FrameBuffer
        vector<vector<uint32_t*>> scanPointers (channels);

        for (int i = 0; i < channels; ++i)
        {
            scanLine[i].resize (width);
            scanPointers[i].resize (width);
        }

        vector<int>  pixelCounts (width);
        vector<half> outputAlpha (
            width); // only required for --mask mode: stores output

        DeepFrameBuffer buf;
        buf.insertSampleCountSlice (Slice (
            UINT,
            (char*) pixelCounts.data () - dataWindow.min.x,
            sizeof (int),
            0));
        int c = 0;

        //
        // read all channels as their native type, so they round trip when writing deep
        //
        for (ChannelList::ConstIterator i = inputChans.begin ();
             i != inputChans.end ();
             ++i, ++c)
        {
            buf.insert (
                i.name (),
                DeepSlice (
                    i.channel ().type,
                    (char*) scanPointers[c].data () - dataWindow.min.x,
                    sizeof (char*),
                    0,
                    sizeof (int32_t)));
        }

        DeepScanLineInputPart inPart (input, pt);
        inPart.setFrameBuffer (buf);

        //
        // for mask, create an alpha channel and initialize a FrameBuffer with that data
        // otherwise, can use the deep frame buffer for both input and output, since the data is processed in-place
        //
        if (mask)
        {
            FrameBuffer outBuf;
            outBuf.insert (
                "A",
                Slice (
                    HALF,
                    (char*) outputAlpha.data () - dataWindow.min.x,
                    sizeof (half),
                    0));
            OutputPart outPart (output, pt);
            outPart.setFrameBuffer (outBuf);
        }
        else
        {
            DeepScanLineOutputPart outPart (output, pt);
            outPart.setFrameBuffer (buf);
        }

        for (int y = dataWindow.min.y; y <= dataWindow.max.y; ++y)
        {
            inPart.readPixelSampleCounts (y);
            for (int c = 0; c < channels; ++c)
            {
                for (int x = 0; x < width; ++x)
                {
                    scanLine[c][x].resize (pixelCounts[x]);
                    scanPointers[c][x] = scanLine[c][x].data ();
                }
            }

            inPart.readPixels (y);

            for (int x = 0; x < width; ++x)
            {
                int outputSample = 0;

                float totalAlpha = 0.f;
                float maskAlpha  = 0.f;

                for (int s = 0; s < pixelCounts[x]; ++s)
                {
                    //
                    // should sample s be retained?
                    // look for an entry in each 'and group' where all the required channels match their
                    // corresponding values
                    //

                    bool good = true;
                    for (list<list<match>>::const_iterator idGroup =
                             ids.begin ();
                         idGroup != ids.end () && good;
                         ++idGroup)
                    {
                        good = false;
                        for (list<match>::const_iterator i = idGroup->begin ();
                             i != idGroup->end () && !good;
                             ++i)
                        {
                            if (scanLine[i->channel1][x][s] == i->id1 &&
                                (i->channel2 == -1 ||
                                 scanLine[i->channel2][x][s] == i->id2))
                            {
                                good = true;
                            }
                        }
                    }

                    //
                    // deep output mode:
                    //   delete unwanted samples
                    // mask output node:
                    //   composite together wanted sample's alpha
                    //

                    if (mask)
                    {
                        //cast alpha to float, and composite
                        float alpha = 0.f;
                        switch (alphaChannelType)
                        {
                            case FLOAT:
                                alpha = *(float*) (&scanLine[alphaChannel][x]
                                                        .data ()[s]);
                                break;
                            case HALF:
                                alpha = *(half*) (&scanLine[alphaChannel][x]
                                                       .data ()[s]);
                                break;
                            case UINT:
                                alpha = scanLine[alphaChannel][x][s];
                                break; //wat! this is a weird thing to do,but whatever...
                            case NUM_PIXELTYPES: break;
                        }

                        if (good) { maskAlpha += (1.0 - totalAlpha) * alpha; }
                        totalAlpha += (1.0 - totalAlpha) * alpha;
                    }

                    else if (good)
                    {
                        // keep Sample: copy from original position into output position
                        // (so overwrite any samples that are to be deleted)
                        for (int c = 0; c < channels; ++c)
                        {
                            scanLine[c][x][outputSample] = scanLine[c][x][s];
                        }
                        outputSample++;
                    }
                }

                if (mask)
                {
                    if (totalAlpha > 0.f) { maskAlpha /= totalAlpha; }
                    outputAlpha[x] = maskAlpha;
                }
                else
                {
                    // update total count of samples
                    pixelCounts[x] = outputSample;
                }
            }

            //
            // write data out
            //
            if (mask)
            {
                OutputPart outPart (output, pt);
                outPart.writePixels (1);
            }
            else
            {
                DeepScanLineOutputPart outPart (output, pt);
                outPart.writePixels (1);
            }
        }
    }
}